

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_>::relocate
          (QArrayDataPointer<std::pair<QFileSystemModelPrivate::QFileSystemNode_*,_int>_> *this,
          qsizetype offset,pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> **data)

{
  pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *d_first;
  pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> *ppVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::
  q_relocate_overlap_n<std::pair<QFileSystemModelPrivate::QFileSystemNode*,int>,long_long>
            (this->ptr,this->size,d_first);
  if (data != (pair<QFileSystemModelPrivate::QFileSystemNode_*,_int> **)0x0) {
    ppVar1 = *data;
    if ((this->ptr <= ppVar1) && (ppVar1 < this->ptr + this->size)) {
      *data = ppVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }